

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void Synthesis(double *f0,int f0_length,double **spectrogram,double **aperiodicity,int fft_size,
              double frame_period,int fs,int y_length,double *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  double *response;
  double *pulse_locations_00;
  int *pulse_locations_index_00;
  double *pulse_locations_time_shift_00;
  double *interpolated_vuv_00;
  double *dc_remover_00;
  int local_234;
  int local_230;
  int j;
  int i_1;
  int upper_limit;
  int lower_limit;
  int offset;
  int index;
  int noise_size;
  double *dc_remover;
  int number_of_pulses;
  double *interpolated_vuv;
  double *pulse_locations_time_shift;
  int *pulse_locations_index;
  double *pulse_locations;
  ForwardRealFFT forward_real_fft;
  InverseRealFFT inverse_real_fft;
  MinimumPhaseAnalysis minimum_phase;
  int i;
  double *impulse_response;
  RandnState randn_state;
  int fs_local;
  double frame_period_local;
  int fft_size_local;
  double **aperiodicity_local;
  double **spectrogram_local;
  int f0_length_local;
  double *f0_local;
  
  randn_state.g_randn_z = fs;
  unique0x10000522 = frame_period;
  memset((void *)((long)&impulse_response + 4),0,0x10);
  randn_reseed((RandnState *)((long)&impulse_response + 4));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)fft_size;
  uVar10 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  response = (double *)operator_new__(uVar10);
  for (minimum_phase.forward_fft.w._4_4_ = 0; minimum_phase.forward_fft.w._4_4_ < y_length;
      minimum_phase.forward_fft.w._4_4_ = minimum_phase.forward_fft.w._4_4_ + 1) {
    y[minimum_phase.forward_fft.w._4_4_] = 0.0;
  }
  memset(&inverse_real_fft.inverse_fft.w,0,0xb0);
  InitializeMinimumPhaseAnalysis(fft_size,(MinimumPhaseAnalysis *)&inverse_real_fft.inverse_fft.w);
  memset(&forward_real_fft.forward_fft.w,0,0x60);
  InitializeInverseRealFFT(fft_size,(InverseRealFFT *)&forward_real_fft.forward_fft.w);
  memset(&pulse_locations,0,0x60);
  InitializeForwardRealFFT(fft_size,(ForwardRealFFT *)&pulse_locations);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)y_length;
  uVar10 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pulse_locations_00 = (double *)operator_new__(uVar10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)y_length;
  uVar10 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pulse_locations_index_00 = (int *)operator_new__(uVar10);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)y_length;
  uVar10 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pulse_locations_time_shift_00 = (double *)operator_new__(uVar10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)y_length;
  uVar10 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  interpolated_vuv_00 = (double *)operator_new__(uVar10);
  iVar7 = anon_unknown.dwarf_7ad8::GetTimeBase
                    (f0,f0_length,randn_state.g_randn_z,stack0xffffffffffffffb0 / 1000.0,y_length,
                     (double)((int)randn_state.g_randn_z / fft_size) + 1.0,pulse_locations_00,
                     pulse_locations_index_00,pulse_locations_time_shift_00,interpolated_vuv_00);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)fft_size;
  uVar10 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  dc_remover_00 = (double *)operator_new__(uVar10);
  anon_unknown.dwarf_7ad8::GetDCRemover(fft_size,dc_remover_00);
  register0x00001200 = stack0xffffffffffffffb0 / 1000.0;
  for (local_230 = 0; local_230 < iVar7; local_230 = local_230 + 1) {
    iVar8 = MyMinInt(iVar7 + -1,local_230 + 1);
    anon_unknown.dwarf_7ad8::GetOneFrameSegment
              (interpolated_vuv_00[pulse_locations_index_00[local_230]],
               pulse_locations_index_00[iVar8] - pulse_locations_index_00[local_230],spectrogram,
               fft_size,aperiodicity,f0_length,stack0xffffffffffffffb0,pulse_locations_00[local_230]
               ,pulse_locations_time_shift_00[local_230],randn_state.g_randn_z,
               (ForwardRealFFT *)&pulse_locations,(InverseRealFFT *)&forward_real_fft.forward_fft.w,
               (MinimumPhaseAnalysis *)&inverse_real_fft.inverse_fft.w,dc_remover_00,response,
               (RandnState *)((long)&impulse_response + 4));
    iVar8 = (pulse_locations_index_00[local_230] - fft_size / 2) + 1;
    local_234 = MyMaxInt(0,-iVar8);
    iVar9 = MyMinInt(fft_size,y_length - iVar8);
    for (; local_234 < iVar9; local_234 = local_234 + 1) {
      y[local_234 + iVar8] = response[local_234] + y[local_234 + iVar8];
    }
  }
  if (dc_remover_00 != (double *)0x0) {
    operator_delete__(dc_remover_00);
  }
  if (pulse_locations_00 != (double *)0x0) {
    operator_delete__(pulse_locations_00);
  }
  if (pulse_locations_index_00 != (int *)0x0) {
    operator_delete__(pulse_locations_index_00);
  }
  if (pulse_locations_time_shift_00 != (double *)0x0) {
    operator_delete__(pulse_locations_time_shift_00);
  }
  if (interpolated_vuv_00 != (double *)0x0) {
    operator_delete__(interpolated_vuv_00);
  }
  DestroyMinimumPhaseAnalysis((MinimumPhaseAnalysis *)&inverse_real_fft.inverse_fft.w);
  DestroyInverseRealFFT((InverseRealFFT *)&forward_real_fft.forward_fft.w);
  DestroyForwardRealFFT((ForwardRealFFT *)&pulse_locations);
  if (response != (double *)0x0) {
    operator_delete__(response);
  }
  return;
}

Assistant:

void Synthesis(const double *f0, int f0_length,
    const double * const *spectrogram, const double * const *aperiodicity,
    int fft_size, double frame_period, int fs, int y_length, double *y) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double *impulse_response = new double[fft_size];

  for (int i = 0; i < y_length; ++i) y[i] = 0.0;

  MinimumPhaseAnalysis minimum_phase = {0};
  InitializeMinimumPhaseAnalysis(fft_size, &minimum_phase);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);
  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);

  double *pulse_locations = new double[y_length];
  int *pulse_locations_index = new int[y_length];
  double *pulse_locations_time_shift = new double[y_length];
  double *interpolated_vuv = new double[y_length];
  int number_of_pulses = GetTimeBase(f0, f0_length, fs, frame_period / 1000.0,
      y_length, fs / fft_size + 1.0, pulse_locations, pulse_locations_index,
      pulse_locations_time_shift, interpolated_vuv);

  double *dc_remover = new double[fft_size];
  GetDCRemover(fft_size, dc_remover);

  frame_period /= 1000.0;
  int noise_size;
  int index, offset, lower_limit, upper_limit;
  for (int i = 0; i < number_of_pulses; ++i) {
    noise_size = pulse_locations_index[MyMinInt(number_of_pulses - 1, i + 1)] -
      pulse_locations_index[i];

    GetOneFrameSegment(interpolated_vuv[pulse_locations_index[i]], noise_size,
        spectrogram, fft_size, aperiodicity, f0_length, frame_period,
        pulse_locations[i], pulse_locations_time_shift[i], fs,
        &forward_real_fft, &inverse_real_fft, &minimum_phase, dc_remover,
        impulse_response, &randn_state);
    offset = pulse_locations_index[i] - fft_size / 2 + 1;
    lower_limit = MyMaxInt(0, -offset);
    upper_limit = MyMinInt(fft_size, y_length - offset);
    for (int j = lower_limit; j < upper_limit; ++j) {
      index = j + offset;
      y[index] += impulse_response[j];
    }
  }

  delete[] dc_remover;
  delete[] pulse_locations;
  delete[] pulse_locations_index;
  delete[] pulse_locations_time_shift;
  delete[] interpolated_vuv;

  DestroyMinimumPhaseAnalysis(&minimum_phase);
  DestroyInverseRealFFT(&inverse_real_fft);
  DestroyForwardRealFFT(&forward_real_fft);

  delete[] impulse_response;
}